

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::ordered_dict<tinyusdz::Relationship>::insert
          (ordered_dict<tinyusdz::Relationship> *this,string *key,Relationship *value)

{
  size_type sVar1;
  mapped_type *this_00;
  Relationship *value_local;
  string *key_local;
  ordered_dict<tinyusdz::Relationship> *this_local;
  
  sVar1 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
          ::count(&this->_m,key);
  if (sVar1 == 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_keys,key);
  }
  this_00 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
            ::operator[](&this->_m,key);
  Relationship::operator=(this_00,value);
  return;
}

Assistant:

void insert(const std::string &key, const T &value) {
    if (_m.count(key)) {
      // overwrite existing value
    } else {
      _keys.push_back(key);
    }

    _m[key] = value;
  }